

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

sigrenderer_t * it_start_sigrenderer(DUH *duh,sigdata_t *vsigdata,int n_channels,int32 pos)

{
  uint uVar1;
  int iVar2;
  DUMB_IT_SIGRENDERER *sigrenderer_00;
  DUMB_CLICK_REMOVER **ppDVar3;
  int in_ECX;
  undefined4 in_EDX;
  double in_RSI;
  DUMB_IT_SIGRENDERER *in_stack_00000008;
  IT_CHECKPOINT *checkpoint;
  IT_CALLBACKS *callbacks;
  DUMB_IT_SIGRENDERER *sigrenderer;
  DUMB_IT_SIGDATA *sigdata;
  int32 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  double in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffffb0;
  uint7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar4;
  undefined8 in_stack_ffffffffffffffc0;
  long *plVar5;
  DUMB_IT_SIGRENDERER *sigdata_00;
  DUMB_IT_SIGRENDERER *local_30;
  int local_20;
  
  sigrenderer_00 = (DUMB_IT_SIGRENDERER *)create_callbacks();
  if (sigrenderer_00 != (DUMB_IT_SIGRENDERER *)0x0) {
    if (*(long *)((long)in_RSI + 0x130) == 0) {
      sigdata_00 = sigrenderer_00;
      dumb_create_click_remover_array(in_stack_ffffffffffffff9c);
      local_30 = init_sigrenderer((DUMB_IT_SIGDATA *)sigdata_00,
                                  (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                  (int)in_stack_ffffffffffffffc0,
                                  (IT_CALLBACKS *)
                                  CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                                  (DUMB_CLICK_REMOVER **)sigrenderer_00);
      local_20 = in_ECX;
      if (local_30 == (DUMB_IT_SIGRENDERER *)0x0) {
        return (sigrenderer_t *)0x0;
      }
    }
    else {
      plVar5 = *(long **)((long)in_RSI + 0x130);
      while( true ) {
        bVar4 = false;
        if (*plVar5 != 0) {
          bVar4 = *(int *)(*plVar5 + 8) < in_ECX;
        }
        if (!bVar4) break;
        plVar5 = (long *)*plVar5;
      }
      local_30 = dup_sigrenderer((DUMB_IT_SIGRENDERER *)(ulong)in_stack_ffffffffffffffb8,
                                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                 (IT_CALLBACKS *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (local_30 == (DUMB_IT_SIGRENDERER *)0x0) {
        return (sigrenderer_t *)0x0;
      }
      ppDVar3 = dumb_create_click_remover_array(in_stack_ffffffffffffff9c);
      local_30->click_remover = ppDVar3;
      local_20 = in_ECX - (int)plVar5[1];
      in_RSI = in_stack_ffffffffffffffa0;
      in_EDX = in_stack_ffffffffffffffac;
      sigrenderer_00 = in_stack_ffffffffffffffb0;
    }
    do {
      uVar1 = in_stack_ffffffffffffff9c & 0xffffff;
      if (0 < local_20) {
        uVar1 = CONCAT13(local_30->time_left <= local_20,(int3)in_stack_ffffffffffffff9c);
      }
      in_stack_ffffffffffffff9c = uVar1;
      if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') {
        render(sigrenderer_00,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffa8),in_RSI,
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(sample_t_conflict **)0x85479d);
        local_30->time_left = local_30->time_left - local_20;
        return local_30;
      }
      render(sigrenderer_00,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffa8),in_RSI,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(sample_t_conflict **)0x854731);
      local_20 = local_20 - local_30->time_left;
      local_30->time_left = 0;
      iVar2 = process_tick(in_stack_00000008);
    } while (iVar2 == 0);
    _dumb_it_end_sigrenderer(sigrenderer_00);
  }
  return (sigrenderer_t *)0x0;
}

Assistant:

static sigrenderer_t *it_start_sigrenderer(DUH *duh, sigdata_t *vsigdata, int n_channels, int32 pos)
{
	DUMB_IT_SIGDATA *sigdata = vsigdata;
	DUMB_IT_SIGRENDERER *sigrenderer;

	(void)duh;

	{
		IT_CALLBACKS *callbacks = create_callbacks();
		if (!callbacks) return NULL;

		if (sigdata->checkpoint) {
			IT_CHECKPOINT *checkpoint = sigdata->checkpoint;
			while (checkpoint->next && checkpoint->next->time < pos)
				checkpoint = checkpoint->next;
			sigrenderer = dup_sigrenderer(checkpoint->sigrenderer, n_channels, callbacks);
			if (!sigrenderer) return NULL;
			sigrenderer->click_remover = dumb_create_click_remover_array(n_channels);
			pos -= checkpoint->time;
		} else {
			sigrenderer = init_sigrenderer(sigdata, n_channels, 0, callbacks,
				dumb_create_click_remover_array(n_channels));
			if (!sigrenderer) return NULL;
		}
	}

	while (pos > 0 && pos >= sigrenderer->time_left) {
		render(sigrenderer, 0, 1.0f, 0, sigrenderer->time_left, NULL);

		pos -= sigrenderer->time_left;
		sigrenderer->time_left = 0;

		if (process_tick(sigrenderer)) {
			_dumb_it_end_sigrenderer(sigrenderer);
			return NULL;
		}
	}

	render(sigrenderer, 0, 1.0f, 0, pos, NULL);
	sigrenderer->time_left -= pos;

	return sigrenderer;
}